

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::routing(Server *this,Request *req,Response *res,Stream *strm,bool last_connection)

{
  bool *pbVar1;
  bool bVar2;
  ContentReader local_1e0;
  ContentReader local_1a0;
  int local_15c;
  ContentReader local_158;
  anon_class_40_5_0abb3629 local_108;
  MultipartReader local_e0;
  anon_class_40_5_0abb3629 local_c0;
  Reader local_98;
  undefined1 local_78 [8];
  ContentReader reader;
  bool last_connection_local;
  Stream *strm_local;
  Response *res_local;
  Request *req_local;
  Server *this_local;
  
  reader.muitlpart_reader_._M_invoker._7_1_ = last_connection;
  bVar2 = std::operator==(&req->method,"GET");
  if ((bVar2) && (bVar2 = handle_file_request(this,req,res), bVar2)) {
    this_local._7_1_ = 1;
    goto LAB_00223839;
  }
  bVar2 = detail::expect_content(req);
  if (bVar2) {
    pbVar1 = (bool *)((long)&reader.muitlpart_reader_._M_invoker + 7);
    local_c0.this = this;
    local_c0.strm = strm;
    local_c0.last_connection = pbVar1;
    local_c0.req = req;
    local_c0.res = res;
    std::function<bool(std::function<bool(char_const*,unsigned_long)>)>::
    function<httplib::Server::routing(httplib::Request&,httplib::Response&,httplib::Stream&,bool)::_lambda(std::function<bool(char_const*,unsigned_long)>)_1_,void>
              ((function<bool(std::function<bool(char_const*,unsigned_long)>)> *)&local_98,&local_c0
              );
    local_108.this = this;
    local_108.strm = strm;
    local_108.last_connection = pbVar1;
    local_108.req = req;
    local_108.res = res;
    std::
    function<bool(std::function<bool(std::__cxx11::string_const&,httplib::MultipartFile_const&)>,std::function<bool(std::__cxx11::string_const&,char_const*,unsigned_long)>)>
    ::
    function<httplib::Server::routing(httplib::Request&,httplib::Response&,httplib::Stream&,bool)::_lambda(std::function<bool(std::__cxx11::string_const&,httplib::MultipartFile_const&)>,std::function<bool(std::__cxx11::string_const&,char_const*,unsigned_long)>)_1_,void>
              ((function<bool(std::function<bool(std::__cxx11::string_const&,httplib::MultipartFile_const&)>,std::function<bool(std::__cxx11::string_const&,char_const*,unsigned_long)>)>
                *)&local_e0,&local_108);
    ContentReader::ContentReader((ContentReader *)local_78,&local_98,&local_e0);
    std::
    function<bool_(std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_httplib::MultipartFile_&)>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_unsigned_long)>)>
    ::~function(&local_e0);
    std::function<bool_(std::function<bool_(const_char_*,_unsigned_long)>)>::~function(&local_98);
    bVar2 = std::operator==(&req->method,"POST");
    if (bVar2) {
      ContentReader::ContentReader(&local_158,(ContentReader *)local_78);
      bVar2 = dispatch_request_for_content_reader
                        (this,req,res,&local_158,&this->post_handlers_for_content_reader_);
      ContentReader::~ContentReader(&local_158);
      if (!bVar2) goto LAB_0022363d;
      this_local._7_1_ = 1;
      local_15c = 1;
    }
    else {
      bVar2 = std::operator==(&req->method,"PUT");
      if (bVar2) {
        ContentReader::ContentReader(&local_1a0,(ContentReader *)local_78);
        bVar2 = dispatch_request_for_content_reader
                          (this,req,res,&local_1a0,&this->put_handlers_for_content_reader_);
        ContentReader::~ContentReader(&local_1a0);
        if (bVar2) {
          this_local._7_1_ = 1;
          local_15c = 1;
          goto LAB_00223647;
        }
      }
      else {
        bVar2 = std::operator==(&req->method,"PATCH");
        if (bVar2) {
          ContentReader::ContentReader(&local_1e0,(ContentReader *)local_78);
          bVar2 = dispatch_request_for_content_reader
                            (this,req,res,&local_1e0,&this->patch_handlers_for_content_reader_);
          ContentReader::~ContentReader(&local_1e0);
          if (bVar2) {
            this_local._7_1_ = 1;
            local_15c = 1;
            goto LAB_00223647;
          }
        }
      }
LAB_0022363d:
      local_15c = 0;
    }
LAB_00223647:
    ContentReader::~ContentReader((ContentReader *)local_78);
    if (local_15c != 0) goto LAB_00223839;
    bVar2 = read_content(this,strm,(bool)(reader.muitlpart_reader_._M_invoker._7_1_ & 1),req,res);
    if (!bVar2) {
      this_local._7_1_ = 0;
      goto LAB_00223839;
    }
  }
  bVar2 = std::operator==(&req->method,"GET");
  if ((bVar2) || (bVar2 = std::operator==(&req->method,"HEAD"), bVar2)) {
    this_local._7_1_ = dispatch_request(this,req,res,&this->get_handlers_);
  }
  else {
    bVar2 = std::operator==(&req->method,"POST");
    if (bVar2) {
      this_local._7_1_ = dispatch_request(this,req,res,&this->post_handlers_);
    }
    else {
      bVar2 = std::operator==(&req->method,"PUT");
      if (bVar2) {
        this_local._7_1_ = dispatch_request(this,req,res,&this->put_handlers_);
      }
      else {
        bVar2 = std::operator==(&req->method,"DELETE");
        if (bVar2) {
          this_local._7_1_ = dispatch_request(this,req,res,&this->delete_handlers_);
        }
        else {
          bVar2 = std::operator==(&req->method,"OPTIONS");
          if (bVar2) {
            this_local._7_1_ = dispatch_request(this,req,res,&this->options_handlers_);
          }
          else {
            bVar2 = std::operator==(&req->method,"PATCH");
            if (bVar2) {
              this_local._7_1_ = dispatch_request(this,req,res,&this->patch_handlers_);
            }
            else {
              res->status = 400;
              this_local._7_1_ = 0;
            }
          }
        }
      }
    }
  }
LAB_00223839:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Server::routing(Request &req, Response &res, Stream &strm,
                            bool last_connection) {
  // File handler
  if (req.method == "GET" && handle_file_request(req, res)) { return true; }

  if (detail::expect_content(req)) {
    // Content reader handler
    {
      ContentReader reader(
        [&](ContentReceiver receiver) {
          return read_content_with_content_receiver(strm, last_connection, req, res,
                                                    receiver, nullptr, nullptr);
        },
        [&](MultipartContentHeader header, MultipartContentReceiver receiver) {
          return read_content_with_content_receiver(strm, last_connection, req, res,
                                                    nullptr, header, receiver);
        }
      );

      if (req.method == "POST") {
        if (dispatch_request_for_content_reader(
                req, res, reader, post_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PUT") {
        if (dispatch_request_for_content_reader(
                req, res, reader, put_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PATCH") {
        if (dispatch_request_for_content_reader(
                req, res, reader, patch_handlers_for_content_reader_)) {
          return true;
        }
      }
    }

    // Read content into `req.body`
    if (!read_content(strm, last_connection, req, res)) { return false; }
  }

  // Regular handler
  if (req.method == "GET" || req.method == "HEAD") {
    return dispatch_request(req, res, get_handlers_);
  } else if (req.method == "POST") {
    return dispatch_request(req, res, post_handlers_);
  } else if (req.method == "PUT") {
    return dispatch_request(req, res, put_handlers_);
  } else if (req.method == "DELETE") {
    return dispatch_request(req, res, delete_handlers_);
  } else if (req.method == "OPTIONS") {
    return dispatch_request(req, res, options_handlers_);
  } else if (req.method == "PATCH") {
    return dispatch_request(req, res, patch_handlers_);
  }

  res.status = 400;
  return false;
}